

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_err_t * mpc_err_file(char *filename,char *failure)

{
  mpc_err_t *pmVar1;
  size_t sVar2;
  char *pcVar3;
  long local_40;
  long local_38;
  long local_30;
  undefined8 local_28;
  mpc_err_t *x;
  char *failure_local;
  char *filename_local;
  
  pmVar1 = (mpc_err_t *)malloc(0x48);
  sVar2 = strlen(filename);
  pcVar3 = (char *)malloc(sVar2 + 1);
  pmVar1->filename = pcVar3;
  strcpy(pmVar1->filename,filename);
  mpc_state_new();
  (pmVar1->state).pos = local_40;
  (pmVar1->state).row = local_38;
  (pmVar1->state).col = local_30;
  *(undefined8 *)&(pmVar1->state).term = local_28;
  pmVar1->expected_num = 0;
  pmVar1->expected = (char **)0x0;
  sVar2 = strlen(failure);
  pcVar3 = (char *)malloc(sVar2 + 1);
  pmVar1->failure = pcVar3;
  strcpy(pmVar1->failure,failure);
  pmVar1->received = ' ';
  return pmVar1;
}

Assistant:

static mpc_err_t *mpc_err_file(const char *filename, const char *failure) {
  mpc_err_t *x;
  x = malloc(sizeof(mpc_err_t));
  x->filename = malloc(strlen(filename) + 1);
  strcpy(x->filename, filename);
  x->state = mpc_state_new();
  x->expected_num = 0;
  x->expected = NULL;
  x->failure = malloc(strlen(failure) + 1);
  strcpy(x->failure, failure);
  x->received = ' ';
  return x;
}